

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 VmEnterFrame(jx9_vm *pVm,void *pUserData,VmFrame **ppFrame)

{
  sxi32 sVar1;
  VmFrame *pSrc;
  ProcCmp in_RCX;
  ProcHash xHash;
  
  pSrc = (VmFrame *)SyMemBackendPoolAlloc(&pVm->sAllocator,0xb0);
  if (pSrc == (VmFrame *)0x0) {
    sVar1 = -1;
  }
  else {
    SyZero(pSrc,0xb0);
    pSrc->pUserData = pUserData;
    pSrc->pVm = pVm;
    SyHashInit(&pSrc->hVar,&pVm->sAllocator,xHash,in_RCX);
    (pSrc->sArg).nUsed = 0;
    (pSrc->sArg).nSize = 0;
    (pSrc->sArg).eSize = 0x10;
    (pSrc->sArg).nCursor = 0;
    (pSrc->sArg).pAllocator = &pVm->sAllocator;
    (pSrc->sArg).pBase = (void *)0x0;
    (pSrc->sArg).pUserData = (void *)0x0;
    (pSrc->sLocal).nUsed = 0;
    (pSrc->sLocal).nSize = 0;
    (pSrc->sLocal).eSize = 0x10;
    (pSrc->sLocal).nCursor = 0;
    (pSrc->sLocal).pAllocator = &pVm->sAllocator;
    (pSrc->sLocal).pBase = (void *)0x0;
    (pSrc->sLocal).pUserData = (void *)0x0;
    pSrc->pParent = pVm->pFrame;
    pVm->pFrame = pSrc;
    sVar1 = 0;
    if (ppFrame != (VmFrame **)0x0) {
      *ppFrame = pSrc;
    }
  }
  return sVar1;
}

Assistant:

static sxi32 VmEnterFrame(
	jx9_vm *pVm,               /* Target VM */
	void *pUserData,           /* Upper-layer private data */
	VmFrame **ppFrame          /* OUT: Top most active frame */
	)
{
	VmFrame *pFrame;
	/* Allocate a new frame */
	pFrame = VmNewFrame(&(*pVm), pUserData);
	if( pFrame == 0 ){
		return SXERR_MEM;
	}
	/* Link to the list of active VM frame */
	pFrame->pParent = pVm->pFrame;
	pVm->pFrame = pFrame;
	if( ppFrame ){
		/* Write a pointer to the new VM frame */
		*ppFrame = pFrame;
	}
	return SXRET_OK;
}